

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_test_generated.h
# Opt level: O2

bool __thiscall SmallStructs::Verify(SmallStructs *this,Verifier *verifier)

{
  bool bVar1;
  Vector<const_EvenSmallStruct_*,_unsigned_int> *vec;
  Vector<const_OddSmallStruct_*,_unsigned_int> *vec_00;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,4), bVar1))
  {
    vec = even_structs(this);
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVector<EvenSmallStruct,_unsigned_int>
                      (verifier,(Vector<EvenSmallStruct,_unsigned_int> *)vec);
    if ((bVar1) &&
       (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,6), bVar1
       )) {
      vec_00 = odd_structs(this);
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVector<OddSmallStruct,_unsigned_int>
                        (verifier,(Vector<OddSmallStruct,_unsigned_int> *)vec_00);
      if (bVar1) {
        verifier->depth_ = verifier->depth_ - 1;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffset(verifier, VT_EVEN_STRUCTS) &&
           verifier.VerifyVector(even_structs()) &&
           VerifyOffset(verifier, VT_ODD_STRUCTS) &&
           verifier.VerifyVector(odd_structs()) &&
           verifier.EndTable();
  }